

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

stCoRoutine_t *
co_create_env(stCoRoutineEnv_t *env,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  uint uVar1;
  stCoRoutine_t *psVar2;
  stStackMem_t *psVar3;
  char *pcVar4;
  int iVar5;
  size_t __size;
  stShareStack_t *psVar6;
  
  __size = 0x20000;
  if (attr == (stCoRoutineAttr_t *)0x0) {
    psVar6 = (stShareStack_t *)0x0;
  }
  else {
    uVar1 = attr->stack_size;
    psVar6 = attr->share_stack;
    if ((0 < (int)uVar1) && (__size = 0x800000, uVar1 < 0x800001)) {
      if ((uVar1 & 0xfff) != 0) {
        uVar1 = (uVar1 & 0xfff000) + 0x1000;
      }
      __size = (size_t)uVar1;
    }
  }
  iVar5 = (int)__size;
  psVar2 = (stCoRoutine_t *)calloc(1,0x20c8);
  psVar2->env = env;
  psVar2->pfn = pfn;
  psVar2->arg = arg;
  if (psVar6 == (stShareStack_t *)0x0) {
    psVar3 = (stStackMem_t *)malloc(0x20);
    psVar3->occupy_co = (stCoRoutine_t *)0x0;
    psVar3->stack_size = iVar5;
    pcVar4 = (char *)malloc(__size);
    psVar3->stack_buffer = pcVar4;
    psVar3->stack_bp = pcVar4 + __size;
  }
  else {
    uVar1 = psVar6->alloc_idx;
    iVar5 = psVar6->stack_size;
    psVar6->alloc_idx = uVar1 + 1;
    psVar3 = psVar6->stack_array[(int)(uVar1 % (uint)psVar6->count)];
    pcVar4 = psVar3->stack_buffer;
  }
  psVar2->stack_mem = psVar3;
  (psVar2->ctx).ss_sp = pcVar4;
  (psVar2->ctx).ss_size = (long)iVar5;
  psVar2->cStart = '\0';
  psVar2->cEnd = '\0';
  psVar2->cIsMain = '\0';
  psVar2->cEnableSysHook = '\0';
  psVar2->cIsShareStack = psVar6 != (stShareStack_t *)0x0;
  psVar2->save_size = 0;
  psVar2->save_buffer = (char *)0x0;
  return psVar2;
}

Assistant:

struct stCoRoutine_t *co_create_env( stCoRoutineEnv_t * env, const stCoRoutineAttr_t* attr,
		pfn_co_routine_t pfn,void *arg )
{

	stCoRoutineAttr_t at;
	if( attr )
	{
		memcpy( &at,attr,sizeof(at) );
	}
	if( at.stack_size <= 0 )
	{
		at.stack_size = 128 * 1024;
	}
	else if( at.stack_size > 1024 * 1024 * 8 )
	{
		at.stack_size = 1024 * 1024 * 8;
	}

	if( at.stack_size & 0xFFF ) 
	{
		at.stack_size &= ~0xFFF;
		at.stack_size += 0x1000;
	}

	stCoRoutine_t *lp = (stCoRoutine_t*)malloc( sizeof(stCoRoutine_t) );
	
	memset( lp,0,(long)(sizeof(stCoRoutine_t))); 


	lp->env = env;
	lp->pfn = pfn;
	lp->arg = arg;

	stStackMem_t* stack_mem = NULL;
	if( at.share_stack )
	{
		stack_mem = co_get_stackmem( at.share_stack);
		at.stack_size = at.share_stack->stack_size;
	}
	else
	{
		stack_mem = co_alloc_stackmem(at.stack_size);
	}
	lp->stack_mem = stack_mem;

	lp->ctx.ss_sp = stack_mem->stack_buffer;
	lp->ctx.ss_size = at.stack_size;

	lp->cStart = 0;
	lp->cEnd = 0;
	lp->cIsMain = 0;
	lp->cEnableSysHook = 0;
	lp->cIsShareStack = at.share_stack != NULL;

	lp->save_size = 0;
	lp->save_buffer = NULL;

	return lp;
}